

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

void u_enumCharTypes_63(UCharEnumTypeRange *enumRange,void *context)

{
  UCharEnumTypeRange *local_28;
  _EnumTypeCallback callback;
  void *context_local;
  UCharEnumTypeRange *enumRange_local;
  
  if (enumRange != (UCharEnumTypeRange *)0x0) {
    local_28 = enumRange;
    callback.enumRange = (UCharEnumTypeRange *)context;
    callback.context = context;
    utrie2_enum_63(&propsTrie,_enumTypeValue,_enumTypeRange,&local_28);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_enumCharTypes(UCharEnumTypeRange *enumRange, const void *context) {
    struct _EnumTypeCallback callback;

    if(enumRange==NULL) {
        return;
    }

    callback.enumRange=enumRange;
    callback.context=context;
    utrie2_enum(&propsTrie, _enumTypeValue, _enumTypeRange, &callback);
}